

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitAggState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::BitStringAggOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  undefined8 uVar3;
  unsigned_long *puVar4;
  AggregateUnaryInput *pAVar5;
  ulong uVar6;
  unsigned_long *puVar7;
  idx_t iVar8;
  ulong uVar9;
  AggregateUnaryInput input_data;
  hugeint_t local_a0;
  idx_t local_90;
  ValidityMask *local_88;
  unsigned_long *local_80;
  undefined1 local_78 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar1 = input->data;
    pAVar5 = (AggregateUnaryInput *)count;
    FlatVector::VerifyFlatVector(input);
    local_88 = &input->validity;
    local_78._16_8_ = (unsigned_long *)0x0;
    if (0x3f < count + 0x3f) {
      uVar9 = 0;
      local_80 = (unsigned_long *)count;
      local_78._0_8_ = aggr_input_data;
      local_78._8_8_ = local_88;
      do {
        uVar3 = local_78._16_8_;
        puVar7 = (local_88->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar7 == (unsigned_long *)0x0) {
          uVar6 = 0xffffffffffffffff;
        }
        else {
          uVar6 = puVar7[uVar9];
        }
        puVar7 = (unsigned_long *)(local_78._16_8_ + 0x40);
        if (local_80 <= (unsigned_long *)(local_78._16_8_ + 0x40)) {
          puVar7 = local_80;
        }
        puVar4 = puVar7;
        if (uVar6 != 0) {
          if (uVar6 == 0xffffffffffffffff) {
            for (; puVar4 = (unsigned_long *)local_78._16_8_, (ulong)local_78._16_8_ < puVar7;
                local_78._16_8_ = local_78._16_8_ + 1) {
              BitStringAggOperation::
              Operation<duckdb::hugeint_t,duckdb::BitAggState<duckdb::hugeint_t>,duckdb::BitStringAggOperation>
                        ((BitStringAggOperation *)state,
                         (BitAggState<duckdb::hugeint_t> *)(pdVar1 + local_78._16_8_ * 0x10),
                         (hugeint_t *)local_78,pAVar5);
            }
          }
          else {
            for (; puVar4 = (unsigned_long *)local_78._16_8_, (ulong)local_78._16_8_ < puVar7;
                local_78._16_8_ = local_78._16_8_ + 1) {
              if ((uVar6 >> ((ulong)(uint)((int)local_78._16_8_ - (int)uVar3) & 0x3f) & 1) != 0) {
                BitStringAggOperation::
                Operation<duckdb::hugeint_t,duckdb::BitAggState<duckdb::hugeint_t>,duckdb::BitStringAggOperation>
                          ((BitStringAggOperation *)state,
                           (BitAggState<duckdb::hugeint_t> *)(pdVar1 + local_78._16_8_ * 0x10),
                           (hugeint_t *)local_78,pAVar5);
              }
            }
          }
        }
        local_78._16_8_ = puVar4;
        uVar9 = uVar9 + 1;
      } while (uVar9 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar7 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar7 == (unsigned_long *)0x0) || ((*puVar7 & 1) != 0)) {
      local_78._8_8_ = &input->validity;
      local_78._16_8_ = (unsigned_long *)0x0;
      local_78._0_8_ = aggr_input_data;
      BitStringAggOperation::
      Operation<duckdb::hugeint_t,duckdb::BitAggState<duckdb::hugeint_t>,duckdb::BitStringAggOperation>
                ((BitStringAggOperation *)state,(BitAggState<duckdb::hugeint_t> *)input->data,
                 (hugeint_t *)local_78,(AggregateUnaryInput *)count);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
    Vector::ToUnifiedFormat(input,count,(UnifiedVectorFormat *)local_78);
    pAVar5 = (AggregateUnaryInput *)(local_78 + 0x10);
    local_90 = 0;
    local_a0.lower = (uint64_t)aggr_input_data;
    local_a0.upper = (int64_t)pAVar5;
    if ((unsigned_long *)local_78._16_8_ == (unsigned_long *)0x0) {
      if (count != 0) {
        psVar2 = *(sel_t **)local_78._0_8_;
        iVar8 = 0;
        do {
          local_90 = iVar8;
          if (psVar2 != (sel_t *)0x0) {
            local_90 = (idx_t)psVar2[iVar8];
          }
          BitStringAggOperation::
          Operation<duckdb::hugeint_t,duckdb::BitAggState<duckdb::hugeint_t>,duckdb::BitStringAggOperation>
                    ((BitStringAggOperation *)state,
                     (BitAggState<duckdb::hugeint_t> *)(local_78._8_8_ + local_90 * 0x10),&local_a0,
                     pAVar5);
          iVar8 = iVar8 + 1;
        } while (count != iVar8);
      }
    }
    else if (count != 0) {
      psVar2 = *(sel_t **)local_78._0_8_;
      iVar8 = 0;
      do {
        local_90 = iVar8;
        if (psVar2 != (sel_t *)0x0) {
          local_90 = (idx_t)psVar2[iVar8];
        }
        if (((unsigned_long *)local_78._16_8_ == (unsigned_long *)0x0) ||
           (pAVar5 = (AggregateUnaryInput *)(local_90 >> 6),
           (*(ulong *)(local_78._16_8_ + pAVar5 * 8) >> (local_90 & 0x3f) & 1) != 0)) {
          BitStringAggOperation::
          Operation<duckdb::hugeint_t,duckdb::BitAggState<duckdb::hugeint_t>,duckdb::BitStringAggOperation>
                    ((BitStringAggOperation *)state,
                     (BitAggState<duckdb::hugeint_t> *)(local_78._8_8_ + local_90 * 0x10),&local_a0,
                     pAVar5);
        }
        iVar8 = iVar8 + 1;
      } while (count != iVar8);
    }
    if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    }
    if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}